

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> *
__thiscall
Catch::Clara::Opt::getHelpColumns
          (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
           *__return_storage_ptr__,Opt *this)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  pointer pbVar4;
  initializer_list<Catch::Clara::Detail::HelpColumns> __l;
  allocator_type local_1e9;
  undefined1 local_1e8 [64];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  pbVar1 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pbVar4 = (this->m_optNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    if (!bVar2) {
      std::operator<<((ostream *)&oss,", ");
    }
    std::operator<<((ostream *)&oss,(string *)pbVar4);
    bVar2 = false;
  }
  if ((this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint._M_string_length != 0) {
    poVar3 = std::operator<<((ostream *)&oss," <");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint
                            );
    std::operator<<(poVar3,'>');
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)(local_1e8 + 0x20),
             &(this->super_ParserRefImpl<Catch::Clara::Opt>).m_description);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1e8;
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::vector(__return_storage_ptr__,__l,&local_1e9);
  Detail::HelpColumns::~HelpColumns((HelpColumns *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Detail::HelpColumns> Opt::getHelpColumns() const {
            std::ostringstream oss;
            bool first = true;
            for (auto const &opt : m_optNames) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if (!m_hint.empty())
                oss << " <" << m_hint << '>';
            return { { oss.str(), m_description } };
        }